

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O0

void __thiscall FunctionDeclarationNode::~FunctionDeclarationNode(FunctionDeclarationNode *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__FunctionDeclarationNode_002b1d58;
  std::shared_ptr<BlockNode>::~shared_ptr((shared_ptr<BlockNode> *)0x1ab03a);
  std::__cxx11::
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  ::~list((list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
           *)0x1ab048);
  std::__cxx11::string::~string((string *)(in_RDI + 2));
  StatementNode::~StatementNode((StatementNode *)0x1ab060);
  return;
}

Assistant:

FunctionDeclarationNode(const std::string& name, const TypeName& returnType, 
    const std::list<std::pair<std::string, TypeName>> args, std::unique_ptr<BlockNode> body):
      name_(name), returnType_(returnType), arguments_(args), body_(std::move(body)) {}